

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntWeakPtr<Diligent::IRenderDevice> * __thiscall
Diligent::RefCntWeakPtr<Diligent::IRenderDevice>::operator=
          (RefCntWeakPtr<Diligent::IRenderDevice> *this,IRenderDevice *pObj)

{
  RefCntWeakPtr<Diligent::IRenderDevice> *pRVar1;
  RefCntWeakPtr<Diligent::IRenderDevice> local_20;
  
  RefCntWeakPtr(&local_20,pObj);
  pRVar1 = operator=(this,&local_20);
  Release(&local_20);
  return pRVar1;
}

Assistant:

RefCntWeakPtr& operator=(T* pObj) noexcept
    {
        return operator=(RefCntWeakPtr(pObj));
    }